

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profit.c
# Opt level: O3

int prf_interface_supported(int version,int revision)

{
  return (int)(revision < 1 && version == 0);
}

Assistant:

int
prf_interface_supported(
    int version,
    int revision )
{
    if ( (version == PROFIT_INTERFACE_VERSION) &&
         (revision <= PROFIT_INTERFACE_REVISION) )
        return TRUE;
    if ( (version < PROFIT_INTERFACE_VERSION) &&
         (version >= (PROFIT_INTERFACE_VERSION - PROFIT_INTERFACE_AGE)) )
        return TRUE;
    return FALSE;
}